

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerSync(Pager *pPager)

{
  sqlite3_file *psVar1;
  int iVar2;
  
  psVar1 = pPager->fd;
  if (pPager->noSync == '\0') {
    iVar2 = (*psVar1->pMethods->xSync)(psVar1,(int)pPager->syncFlags);
    return iVar2;
  }
  if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
    iVar2 = (*psVar1->pMethods->xFileControl)(psVar1,8,(void *)0x0);
    if (iVar2 == 0xc) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSync(Pager *pPager){
  int rc = SQLITE_OK;
  if( !pPager->noSync ){
    assert( !MEMDB );
    rc = sqlite3OsSync(pPager->fd, pPager->syncFlags);
  }else if( isOpen(pPager->fd) ){
    assert( !MEMDB );
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_SYNC_OMITTED, 0);
    if( rc==SQLITE_NOTFOUND ){
      rc = SQLITE_OK;
    }
  }
  return rc;
}